

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O2

int secp256k1_ecdsa_sig_sign
              (secp256k1_ecmult_gen_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_scalar *seckey,secp256k1_scalar *message,secp256k1_scalar *nonce,int *recid)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uchar b [32];
  secp256k1_scalar n;
  secp256k1_ge r;
  secp256k1_gej rp;
  int local_18c;
  secp256k1_scalar *local_188;
  secp256k1_scalar *local_180;
  uchar local_178 [40];
  secp256k1_scalar local_150;
  secp256k1_ge local_130;
  secp256k1_gej local_c8;
  
  local_18c = 0;
  local_188 = seckey;
  local_180 = message;
  secp256k1_ecmult_gen(ctx,&local_c8,nonce);
  secp256k1_ge_set_gej(&local_130,&local_c8);
  secp256k1_fe_normalize(&local_130.x);
  secp256k1_fe_normalize(&local_130.y);
  secp256k1_fe_get_b32(local_178,&local_130.x);
  secp256k1_scalar_set_b32(sigr,local_178,&local_18c);
  iVar1 = local_18c;
  if (recid != (int *)0x0) {
    iVar2 = secp256k1_fe_is_odd(&local_130.y);
    *recid = iVar2 + iVar1 * 2;
  }
  secp256k1_scalar_mul(&local_150,sigr,local_188);
  secp256k1_scalar_add(&local_150,&local_150,local_180);
  secp256k1_scalar_inverse(sigs,nonce);
  secp256k1_scalar_mul(sigs,sigs,&local_150);
  secp256k1_scalar_clear(&local_150);
  secp256k1_gej_clear(&local_c8);
  secp256k1_ge_clear(&local_130);
  uVar3 = secp256k1_scalar_is_high(sigs);
  secp256k1_scalar_cond_negate(sigs,uVar3);
  if (recid != (int *)0x0) {
    *recid = *recid ^ uVar3;
  }
  uVar3 = secp256k1_scalar_is_zero(sigr);
  uVar4 = secp256k1_scalar_is_zero(sigs);
  return (uVar4 ^ 1) & ~uVar3;
}

Assistant:

static int secp256k1_ecdsa_sig_sign(const secp256k1_ecmult_gen_context *ctx, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_scalar *seckey, const secp256k1_scalar *message, const secp256k1_scalar *nonce, int *recid) {
    unsigned char b[32];
    secp256k1_gej rp;
    secp256k1_ge r;
    secp256k1_scalar n;
    int overflow = 0;
    int high;

    secp256k1_ecmult_gen(ctx, &rp, nonce);
    secp256k1_ge_set_gej(&r, &rp);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_normalize(&r.y);
    secp256k1_fe_get_b32(b, &r.x);
    secp256k1_scalar_set_b32(sigr, b, &overflow);
    if (recid) {
        /* The overflow condition is cryptographically unreachable as hitting it requires finding the discrete log
         * of some P where P.x >= order, and only 1 in about 2^127 points meet this criteria.
         */
        *recid = (overflow << 1) | secp256k1_fe_is_odd(&r.y);
    }
    secp256k1_scalar_mul(&n, sigr, seckey);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, nonce);
    secp256k1_scalar_mul(sigs, sigs, &n);
    secp256k1_scalar_clear(&n);
    secp256k1_gej_clear(&rp);
    secp256k1_ge_clear(&r);
    high = secp256k1_scalar_is_high(sigs);
    secp256k1_scalar_cond_negate(sigs, high);
    if (recid) {
        *recid ^= high;
    }
    /* P.x = order is on the curve, so technically sig->r could end up being zero, which would be an invalid signature.
     * This is cryptographically unreachable as hitting it requires finding the discrete log of P.x = N.
     */
    return (int)(!secp256k1_scalar_is_zero(sigr)) & (int)(!secp256k1_scalar_is_zero(sigs));
}